

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O0

void __thiscall iaf_psc_alpha::iaf_psc_alpha(iaf_psc_alpha *this,long n_populationID,int n_neuronID)

{
  double *pdVar1;
  void *pvVar2;
  undefined4 in_EDX;
  double in_RSI;
  iaf_psc_alpha_param *in_RDI;
  
  Neuron::Neuron((Neuron *)in_RDI);
  in_RDI->Tau_ = (double)&PTR_update_0018fc20;
  *(undefined1 *)&in_RDI->I_e_ = 1;
  pdVar1 = &in_RDI->Theta_;
  pvVar2 = operator_new(0x50);
  iaf_psc_alpha_param::iaf_psc_alpha_param(in_RDI);
  *pdVar1 = (double)pvVar2;
  in_RDI->tau_ex_ = 0.0;
  in_RDI->tau_in_ = 0.0;
  in_RDI[1].Tau_ = 0.0;
  in_RDI[1].C_ = 0.0;
  in_RDI[1].TauR_ = 0.0;
  in_RDI[1].E_L_ = 0.0;
  *(undefined4 *)&in_RDI[1].I_e_ = 0;
  in_RDI[3].E_L_ = 0.0;
  in_RDI[3].I_e_ = 0.0;
  in_RDI->C_ = in_RSI;
  *(undefined4 *)&in_RDI->TauR_ = in_EDX;
  Neuron::initialize((Neuron *)in_RDI);
  return;
}

Assistant:

iaf_psc_alpha::iaf_psc_alpha(long n_populationID, int n_neuronID) : param(new iaf_psc_alpha_param) {
    populationID = n_populationID;
    neuronID = n_neuronID;
    initialize();
}